

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkageUntangler.cc
# Opt level: O1

void __thiscall
LinkageUntangler::select_by_size(LinkageUntangler *this,uint64_t min_size,uint64_t max_size)

{
  ulong *puVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  difference_type __n;
  ulong uVar5;
  ulong uVar6;
  
  lVar2 = *(long *)(**(long **)this + 0x40);
  uVar6 = (*(long *)(**(long **)this + 0x48) - lVar2 >> 3) * 0x6db6db6db6db6db7;
  if (1 < uVar6) {
    lVar3 = *(long *)(this + 8);
    pcVar4 = (char *)(lVar2 + 0x58);
    uVar5 = 1;
    do {
      if (*pcVar4 != '\x01') {
        if ((min_size <= *(ulong *)(pcVar4 + -0x18)) &&
           (max_size == 0 || *(ulong *)(pcVar4 + -0x18) <= max_size)) {
          puVar1 = (ulong *)(lVar3 + (uVar5 >> 6) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)uVar5 & 0x3f);
        }
      }
      uVar5 = uVar5 + 1;
      pcVar4 = pcVar4 + 0x38;
    } while (uVar6 - uVar5 != 0);
  }
  return;
}

Assistant:

void LinkageUntangler::select_by_size( uint64_t min_size, uint64_t max_size) {
    {
        for (auto n=1;n<dg.sdg.nodes.size();++n) {
            if (dg.sdg.nodes[n].status==NodeStatus::Deleted) continue;
            if (dg.sdg.nodes[n].sequence.size() >= min_size and
                (max_size==0 or dg.sdg.nodes[n].sequence.size() <= max_size))
                selected_nodes[n]=true;
        }
    }
}